

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::gatherv_big<std::tuple<int,int,int>>
               (tuple<int,_int,_int> *data,size_t size,tuple<int,_int,_int> *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm
               )

{
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  tuple<int,_int,_int> *__last;
  MPI_Request *ppoVar3;
  ulong uVar4;
  long lVar5;
  datatype dt_1;
  datatype dt;
  requests reqs;
  
  reqs._vptr_requests = (_func_int **)&PTR__requests_001aad80;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (comm->m_rank == root) {
    __last = data + size;
    lVar5 = 0;
    for (uVar4 = 0; (long)uVar4 < (long)comm->m_size; uVar4 = uVar4 + 1) {
      dt_1.mpitype = datatype_builder<std::tuple<int,_int,_int>_>::get_type();
      dt_1._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
      dt_1.builtin = false;
      datatype::contiguous
                (&dt,&dt_1,
                 (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar4]);
      datatype::~datatype(&dt_1);
      poVar2 = dt.mpitype;
      if ((uint)root == uVar4) {
        size = (size_t)__last;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<std::tuple<int,int,int>const*,std::tuple<int,int,int>*>(data,__last,out + lVar5);
      }
      else {
        poVar1 = comm->mpi_comm;
        ppoVar3 = requests::add(&reqs);
        size = 1;
        MPI_Irecv(out + lVar5,1,poVar2,uVar4 & 0xffffffff,0x4d2,poVar1,ppoVar3);
      }
      lVar5 = lVar5 + (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar4];
      datatype::~datatype(&dt);
    }
  }
  else {
    dt_1.mpitype = datatype_builder<std::tuple<int,_int,_int>_>::get_type();
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
    dt_1.builtin = false;
    datatype::contiguous(&dt,&dt_1,size);
    datatype::~datatype(&dt_1);
    poVar1 = comm->mpi_comm;
    ppoVar3 = requests::add(&reqs);
    size = 1;
    MPI_Isend(data,1,dt.mpitype,(ulong)(uint)root,0x4d2,poVar1,ppoVar3);
    datatype::~datatype(&dt);
  }
  requests::wait(&reqs,(void *)size);
  requests::~requests(&reqs);
  return;
}

Assistant:

void gatherv_big(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(data, data+size, out+offset);
            } else {
                MPI_Irecv(const_cast<T*>(out)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += recv_sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
        MPI_Isend(const_cast<T*>(data), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}